

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.hpp
# Opt level: O1

Gen<rc::detail::Any> * __thiscall
rc::gen::map<unsigned_long,rc::detail::Any(*)(unsigned_long&&)>
          (Gen<rc::detail::Any> *__return_storage_ptr__,gen *this,Gen<unsigned_long> *gen,
          _func_Any_unsigned_long_ptr **mapper)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  IGenImpl *pIVar3;
  _func_int **pp_Var4;
  IGenImpl *pIVar5;
  IGenImpl *pIVar6;
  Gen<unsigned_long> local_88;
  IGenImpl *local_60;
  Gen<unsigned_long> local_58;
  
  pIVar3 = *(IGenImpl **)this;
  paVar2 = &local_88.m_name.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x18);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(this + 8) == paVar1) {
    local_88.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.m_name.field_2._8_8_ = *(undefined8 *)(this + 0x20);
    local_88.m_name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_88.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.m_name._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(this + 8);
  }
  pp_Var4 = *(_func_int ***)(this + 0x10);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 8) = paVar1;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (gen)0x0;
  *(undefined8 *)this = 0;
  pIVar5 = gen->m_impl;
  paVar1 = &local_58.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p == paVar2) {
    local_58.m_name.field_2._8_8_ = local_88.m_name.field_2._8_8_;
    local_58.m_name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_58.m_name._M_dataplus._M_p = local_88.m_name._M_dataplus._M_p;
  }
  local_58.m_name.field_2._M_allocated_capacity = local_88.m_name.field_2._M_allocated_capacity;
  local_88.m_name._M_string_length = 0;
  local_88.m_name.field_2._M_allocated_capacity =
       local_88.m_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_88.m_impl = (IGenImpl *)0x0;
  local_88.m_name._M_dataplus._M_p = (pointer)paVar2;
  local_60 = pIVar5;
  local_58.m_impl = pIVar3;
  local_58.m_name._M_string_length = (size_type)pp_Var4;
  pIVar6 = (IGenImpl *)operator_new(0x40);
  pIVar6->_vptr_IGenImpl = (_func_int **)&PTR_generate_001b3e08;
  pIVar6[1]._vptr_IGenImpl = (_func_int **)pIVar5;
  pIVar6[2]._vptr_IGenImpl = (_func_int **)pIVar3;
  pIVar6[3]._vptr_IGenImpl = (_func_int **)(pIVar6 + 5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_name._M_dataplus._M_p == paVar1) {
    pIVar6[5]._vptr_IGenImpl = (_func_int **)local_58.m_name.field_2._M_allocated_capacity;
    pIVar6[6]._vptr_IGenImpl = (_func_int **)local_58.m_name.field_2._8_8_;
  }
  else {
    pIVar6[3]._vptr_IGenImpl = (_func_int **)local_58.m_name._M_dataplus._M_p;
    pIVar6[5]._vptr_IGenImpl = (_func_int **)local_58.m_name.field_2._M_allocated_capacity;
  }
  pIVar6[4]._vptr_IGenImpl = pp_Var4;
  local_58.m_name._M_string_length = 0;
  local_58.m_name.field_2._M_allocated_capacity =
       local_58.m_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_58.m_impl = (IGenImpl *)0x0;
  pIVar6[7]._vptr_IGenImpl = (_func_int **)0x1;
  __return_storage_ptr__->m_impl = pIVar6;
  (__return_storage_ptr__->m_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_name).field_2;
  (__return_storage_ptr__->m_name)._M_string_length = 0;
  (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  local_58.m_name._M_dataplus._M_p = (pointer)paVar1;
  Gen<unsigned_long>::~Gen(&local_58);
  Gen<unsigned_long>::~Gen(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Gen<Decay<typename rc::compat::return_type<Mapper,T>::type>> map(Gen<T> gen,
                                                         Mapper &&mapper) {
  return detail::MapGen<T, Decay<Mapper>>(std::move(gen),
                                          std::forward<Mapper>(mapper));
}